

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void float64_suite::test_minus_one(void)

{
  value_type input [9];
  decoder decoder;
  return_type local_78;
  ulong local_70;
  uchar local_68 [16];
  decoder local_58;
  
  local_58.input._M_str = local_68;
  local_68[0] = 0xd7;
  local_68[1] = '\0';
  local_68[2] = '\0';
  local_68[3] = '\0';
  local_68[4] = '\0';
  local_68[5] = '\0';
  local_68[6] = '\0';
  local_68[7] = 0xf0;
  local_68[8] = 0xbf;
  local_58.input._M_len = 9;
  local_58.current.view._M_len = 0;
  local_58.current.view._M_str = (uchar *)0x0;
  local_58.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_78 = (return_type)CONCAT44(local_78._4_4_,local_58.current.code);
  local_70 = CONCAT44(local_70._4_4_,0xd7);
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::float64",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x333,"void float64_suite::test_minus_one()",&local_78,&local_70);
  local_78 = trial::protocol::bintoken::detail::decoder::
             overloader<trial::protocol::bintoken::token::float64>::decode(&local_58);
  local_70 = 0xbff0000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("decoder.value<token::float64>()","-1.0",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x334,"void float64_suite::test_minus_one()",&local_78,&local_70);
  trial::protocol::bintoken::detail::decoder::next(&local_58);
  local_78 = (return_type)CONCAT44(local_78._4_4_,local_58.current.code);
  local_70 = local_70 & 0xffffffff00000000;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x336,"void float64_suite::test_minus_one()",&local_78,&local_70);
  return;
}

Assistant:

void test_minus_one()
{
    const value_type input[] = { token::code::float64, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0xF0, 0xBF };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::float64);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.value<token::float64>(), -1.0);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}